

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPF.cpp
# Opt level: O0

short * __thiscall EDPF::ComputePrewitt3x3(EDPF *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  short *__s;
  void *__s_00;
  int local_48;
  int local_44;
  int i_2;
  int i_1;
  int size;
  int g;
  int gy;
  int gx;
  int com2;
  int com1;
  int j;
  int i;
  int *grads;
  short *gradImg;
  EDPF *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((this->super_ED).width * (this->super_ED).height);
  uVar5 = SUB168(auVar1 * ZEXT816(2),0);
  if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s = (short *)operator_new__(uVar5);
  memset(__s,0,(long)(this->super_ED).width * 2 * (long)(this->super_ED).height);
  __s_00 = operator_new__(0x20000);
  memset(__s_00,0,0x20000);
  for (com1 = 1; com1 < (this->super_ED).height + -1; com1 = com1 + 1) {
    for (com2 = 1; com2 < (this->super_ED).width + -1; com2 = com2 + 1) {
      iVar2 = (uint)(this->super_ED).smoothImg[(com1 + 1) * (this->super_ED).width + com2 + 1] -
              (uint)(this->super_ED).smoothImg[(com1 + -1) * (this->super_ED).width + com2 + -1];
      iVar3 = (uint)(this->super_ED).smoothImg[(com1 + -1) * (this->super_ED).width + com2 + 1] -
              (uint)(this->super_ED).smoothImg[(com1 + 1) * (this->super_ED).width + com2 + -1];
      iVar4 = iVar2 + iVar3 +
              ((uint)(this->super_ED).smoothImg[com1 * (this->super_ED).width + com2 + 1] -
              (uint)(this->super_ED).smoothImg[com1 * (this->super_ED).width + com2 + -1]);
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      iVar2 = (iVar2 - iVar3) +
              ((uint)(this->super_ED).smoothImg[(com1 + 1) * (this->super_ED).width + com2] -
              (uint)(this->super_ED).smoothImg[(com1 + -1) * (this->super_ED).width + com2]);
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      iVar4 = iVar4 + iVar2;
      __s[com1 * (this->super_ED).width + com2] = (short)iVar4;
      *(int *)((long)__s_00 + (long)iVar4 * 4) = *(int *)((long)__s_00 + (long)iVar4 * 4) + 1;
    }
  }
  iVar4 = (this->super_ED).width;
  iVar2 = (this->super_ED).height;
  for (local_44 = 0x7fff; 0 < local_44; local_44 = local_44 + -1) {
    *(int *)((long)__s_00 + (long)(local_44 + -1) * 4) =
         *(int *)((long)__s_00 + (long)local_44 * 4) +
         *(int *)((long)__s_00 + (long)(local_44 + -1) * 4);
  }
  for (local_48 = 0; local_48 < 0x8000; local_48 = local_48 + 1) {
    this->H[local_48] =
         (double)*(int *)((long)__s_00 + (long)local_48 * 4) / (double)((iVar4 + -2) * (iVar2 + -2))
    ;
  }
  if (__s_00 != (void *)0x0) {
    operator_delete__(__s_00);
  }
  return __s;
}

Assistant:

short * EDPF::ComputePrewitt3x3()
{
	short *gradImg = new short[width*height];
	memset(gradImg, 0, sizeof(short)*width*height);

	int *grads = new int[MAX_GRAD_VALUE];
	memset(grads, 0, sizeof(int)*MAX_GRAD_VALUE);

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Prewitt Operator in horizontal and vertical direction
			// A B C
			// D x E
			// F G H
			// gx = (C-A) + (E-D) + (H-F)
			// gy = (F-A) + (G-B) + (H-C)
			//
			// To make this faster: 
			// com1 = (H-A)
			// com2 = (C-F)
			// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
			//       gy = com1 - com2 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
			// 
			int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[(i - 1)*width + j - 1];
			int com2 = smoothImg[(i - 1)*width + j + 1] - smoothImg[(i + 1)*width + j - 1];

			int gx = abs(com1 + com2 + (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
			int gy = abs(com1 - com2 + (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));

			int g = gx + gy;

			gradImg[i*width + j] = g;
			grads[g]++;
		} // end-for
	} //end-for

	 // Compute probability function H
	int size = (width - 2)*(height - 2);
	
	for (int i = MAX_GRAD_VALUE - 1; i>0; i--)
		grads[i - 1] += grads[i];
	
	for (int i = 0; i < MAX_GRAD_VALUE; i++)
		H[i] = (double)grads[i] / ((double)size);

	delete[] grads;
	return gradImg;
}